

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
ft::list<int,_ft::allocator<int>_>::split
          (list<int,_ft::allocator<int>_> *this,list<int,_ft::allocator<int>_> *first,
          list<int,_ft::allocator<int>_> *second)

{
  undefined8 uVar1;
  Node *this_00;
  size_type sVar2;
  size_t in_R9;
  uint in_stack_ffffffffffffff68;
  undefined1 local_78 [48];
  undefined1 local_48 [24];
  size_type i;
  iterator it;
  list<int,_ft::allocator<int>_> *second_local;
  list<int,_ft::allocator<int>_> *first_local;
  list<int,_ft::allocator<int>_> *this_local;
  
  it.m_node = (Node *)second;
  begin((list<int,_ft::allocator<int>_> *)&i);
  local_48._16_8_ = 0;
  while( true ) {
    uVar1 = local_48._16_8_;
    sVar2 = size(first);
    this_00 = it.m_node;
    if (sVar2 >> 1 <= (ulong)uVar1) break;
    listIterator<int>::operator++((listIterator<int> *)&i);
    local_48._16_8_ = local_48._16_8_ + 1;
  }
  begin((list<int,_ft::allocator<int>_> *)local_48);
  listIterator<int>::listIterator((listIterator<int> *)(local_78 + 0x10),(listIterator<int> *)&i);
  end((list<int,_ft::allocator<int>_> *)local_78);
  splice((list<int,_ft::allocator<int>_> *)this_00,(int)local_48,(__off64_t *)first,
         (int)local_78 + 0x10,(__off64_t *)local_78,in_R9,in_stack_ffffffffffffff68);
  listIterator<int>::~listIterator((listIterator<int> *)local_78);
  listIterator<int>::~listIterator((listIterator<int> *)(local_78 + 0x10));
  listIterator<int>::~listIterator((listIterator<int> *)local_48);
  listIterator<int>::~listIterator((listIterator<int> *)&i);
  return;
}

Assistant:

void split(list & first, list & second) {
		iterator	it(first.begin());
		for (size_type i = 0; i < first.size() / 2; ++i)
			++it;
		second.splice(second.begin(), first, it, first.end());
	}